

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::InputTypes::Run(InputTypes *this)

{
  uint uVar1;
  size_t sVar2;
  GLuint GVar3;
  char *src_vs;
  char *src_fs;
  mapped_type *pmVar4;
  CallLogWrapper *this_00;
  allocator<char> local_919;
  key_type local_918;
  undefined8 uStack_8f8;
  GLint expected8 [11];
  undefined8 uStack_8a8;
  GLint expected7 [11];
  undefined8 uStack_858;
  GLint expected6 [11];
  undefined8 uStack_808;
  GLint expected5 [11];
  undefined8 uStack_7b8;
  GLint expected4 [11];
  undefined8 uStack_768;
  GLint expected3 [11];
  undefined8 uStack_718;
  GLint expected2 [11];
  undefined8 uStack_6c8;
  GLint expected [11];
  GLenum props [11];
  allocator<char> local_661;
  string local_660 [39];
  allocator<char> local_639;
  string local_638 [39];
  allocator<char> local_611;
  string local_610 [39];
  allocator<char> local_5e9;
  string local_5e8 [39];
  allocator<char> local_5c1;
  string local_5c0 [39];
  allocator<char> local_599;
  string local_598 [39];
  allocator<char> local_571;
  string local_570 [39];
  allocator<char> local_549;
  string local_548 [39];
  allocator<char> local_521;
  string local_520 [39];
  allocator<char> local_4f9;
  string local_4f8 [39];
  allocator<char> local_4d1;
  string local_4d0 [39];
  allocator<char> local_4a9;
  string local_4a8 [39];
  allocator<char> local_481;
  string local_480 [39];
  allocator<char> local_459;
  string local_458 [39];
  allocator<char> local_431;
  key_type local_430;
  allocator<char> local_409;
  string local_408 [39];
  allocator<char> local_3e1;
  key_type local_3e0;
  allocator<char> local_3b9;
  string local_3b8 [39];
  allocator<char> local_391;
  key_type local_390;
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  key_type local_340;
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  key_type local_2f0;
  allocator<char> local_2c9;
  string local_2c8 [39];
  allocator<char> local_2a1;
  key_type local_2a0;
  allocator<char> local_279;
  string local_278 [39];
  allocator<char> local_251;
  key_type local_250;
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  key_type local_200;
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indices;
  long error;
  string local_58 [32];
  string local_38 [36];
  GLuint local_14;
  InputTypes *pIStack_10;
  GLuint program;
  InputTypes *this_local;
  
  pIStack_10 = this;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(local_58);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar3 = PIQBase::CreateProgram((PIQBase *)this,src_vs,src_fs,false);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  local_14 = GVar3;
  glu::CallLogWrapper::glBindAttribLocation(this_00,GVar3,0,"a");
  glu::CallLogWrapper::glBindAttribLocation(this_00,local_14,4,"b");
  glu::CallLogWrapper::glBindAttribLocation(this_00,local_14,5,"c");
  glu::CallLogWrapper::glBindAttribLocation(this_00,local_14,7,"d");
  glu::CallLogWrapper::glBindAttribLocation(this_00,local_14,0xb,"e");
  glu::CallLogWrapper::glBindAttribLocation(this_00,local_14,0xc,"f");
  glu::CallLogWrapper::glBindAttribLocation(this_00,local_14,0xd,"g");
  glu::CallLogWrapper::glBindAttribLocation(this_00,local_14,0xf,"h");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,local_14,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,local_14);
  indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)local_14,0x92e3,0x92f5,8);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)local_14,0x92e3,0x92f6,5,&indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_a0);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"a",&local_c1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar3,0x92e3,local_a0,local_c0,
    &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"b",&local_e9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar3,0x92e3,local_a0,local_e8,
    &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"c[0]",&local_111);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar3,0x92e3,local_a0,local_110,
    &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"d",&local_139);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar3,0x92e3,local_a0,local_138,
    &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"e",&local_161);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar3,0x92e3,local_a0,local_160,
    &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"f",&local_189);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar3,0x92e3,local_a0,local_188,
    &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"g",&local_1b1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar3,0x92e3,local_a0,local_1b0,
    &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"h",&local_1d9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar3,0x92e3,local_a0,local_1d8,
    &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"a",&local_201);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_200);
  uVar1 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_228,"a",&local_229);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar3,0x92e3,(ulong)uVar1,local_228,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"b",&local_251);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_250);
  uVar1 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_278,"b",&local_279);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar3,0x92e3,(ulong)uVar1,local_278,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"c[0]",&local_2a1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_2a0);
  uVar1 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c8,"c[0]",&local_2c9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar3,0x92e3,(ulong)uVar1,local_2c8,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"d",&local_2f1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_2f0);
  uVar1 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_318,"d[0]",&local_319);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar3,0x92e3,(ulong)uVar1,local_318,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"e",&local_341);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_340);
  uVar1 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_368,"e",&local_369);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar3,0x92e3,(ulong)uVar1,local_368,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator(&local_369);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"f",&local_391);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_390);
  uVar1 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"f",&local_3b9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar3,0x92e3,(ulong)uVar1,local_3b8,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"g",&local_3e1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_3e0);
  uVar1 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_408,"g[0]",&local_409);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar3,0x92e3,(ulong)uVar1,local_408,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator(&local_409);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"h",&local_431);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_430);
  uVar1 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_458,"h",&local_459);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar3,0x92e3,(ulong)uVar1,local_458,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator(&local_459);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_480,"a",&local_481);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_480,0,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator(&local_481);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4a8,"b",&local_4a9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_4a8,4,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d0,"c[0]",&local_4d1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_4d0,5,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4f8,"c",&local_4f9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_4f8,5,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_520,"c[1]",&local_521);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_520,6,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator(&local_521);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_548,"d[0]",&local_549);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_548,7,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator(&local_549);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_570,"d",&local_571);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_570,7,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator(&local_571);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_598,"e",&local_599);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_598,0xb,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator(&local_599);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"f",&local_5c1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_5c0,0xc,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5e8,"g[0]",&local_5e9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_5e8,0xd,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_610,"g",&local_611);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_610,0xd,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator(&local_611);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_638,"g[1]",&local_639);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_638,0xe,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_639);
  GVar3 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_660,"h",&local_661);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar3,0x92e3,local_660,0xf,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator(&local_661);
  GVar3 = local_14;
  stack0xfffffffffffff968 = 0x92fa000092f9;
  expected[7] = 0;
  expected[8] = 0;
  expected[2] = 0;
  expected[3] = 0;
  expected[4] = 0;
  expected[5] = 0;
  uStack_6c8 = 0x8b5c00000002;
  expected[0] = 1;
  expected[1] = 0;
  expected[6] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expected2 + 10),"a",(allocator<char> *)((long)expected2 + 0x27));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,(key_type *)(expected2 + 10));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)GVar3,0x92e3,(ulong)*pmVar4,0xb,expected + 10,0xb,&uStack_6c8,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)(expected2 + 10));
  std::allocator<char>::~allocator((allocator<char> *)((long)expected2 + 0x27));
  GVar3 = local_14;
  expected2[2] = 0;
  expected2[3] = 0;
  expected2[4] = 0;
  expected2[5] = 0;
  uStack_718 = 0x8b5500000002;
  expected2[0] = 1;
  expected2[1] = 0;
  expected2[6] = 1;
  expected2[7] = 4;
  expected2[8] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expected3 + 10),"b",(allocator<char> *)((long)expected3 + 0x27));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,(key_type *)(expected3 + 10));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)GVar3,0x92e3,(ulong)*pmVar4,0xb,expected + 10,0xb,&uStack_718,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)(expected3 + 10));
  std::allocator<char>::~allocator((allocator<char> *)((long)expected3 + 0x27));
  GVar3 = local_14;
  expected3[2] = 0;
  expected3[3] = 0;
  expected3[4] = 0;
  expected3[5] = 0;
  uStack_768 = 0x140600000005;
  expected3[0] = 2;
  expected3[1] = 0;
  expected3[6] = 1;
  expected3[7] = 5;
  expected3[8] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expected4 + 10),"c[0]",(allocator<char> *)((long)expected4 + 0x27));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,(key_type *)(expected4 + 10));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)GVar3,0x92e3,(ulong)*pmVar4,0xb,expected + 10,0xb,&uStack_768,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)(expected4 + 10));
  std::allocator<char>::~allocator((allocator<char> *)((long)expected4 + 0x27));
  GVar3 = local_14;
  expected4[2] = 0;
  expected4[3] = 0;
  expected4[4] = 0;
  expected4[5] = 0;
  uStack_7b8 = 0x8b6500000005;
  expected4[0] = 2;
  expected4[1] = 0;
  expected4[6] = 1;
  expected4[7] = 7;
  expected4[8] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expected5 + 10),"d",(allocator<char> *)((long)expected5 + 0x27));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,(key_type *)(expected5 + 10));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)GVar3,0x92e3,(ulong)*pmVar4,0xb,expected + 10,0xb,&uStack_7b8,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)(expected5 + 10));
  std::allocator<char>::~allocator((allocator<char> *)((long)expected5 + 0x27));
  GVar3 = local_14;
  expected5[2] = 0;
  expected5[3] = 0;
  expected5[4] = 0;
  expected5[5] = 0;
  uStack_808 = 0x8dc600000002;
  expected5[0] = 1;
  expected5[1] = 0;
  expected5[6] = 1;
  expected5[7] = 0xb;
  expected5[8] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expected6 + 10),"e",(allocator<char> *)((long)expected6 + 0x27));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,(key_type *)(expected6 + 10));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)GVar3,0x92e3,(ulong)*pmVar4,0xb,expected + 10,0xb,&uStack_808,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)(expected6 + 10));
  std::allocator<char>::~allocator((allocator<char> *)((long)expected6 + 0x27));
  GVar3 = local_14;
  expected6[2] = 0;
  expected6[3] = 0;
  expected6[4] = 0;
  expected6[5] = 0;
  uStack_858 = 0x140500000002;
  expected6[0] = 1;
  expected6[1] = 0;
  expected6[6] = 1;
  expected6[7] = 0xc;
  expected6[8] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expected7 + 10),"f",(allocator<char> *)((long)expected7 + 0x27));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,(key_type *)(expected7 + 10));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)GVar3,0x92e3,(ulong)*pmVar4,0xb,expected + 10,0xb,&uStack_858,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)(expected7 + 10));
  std::allocator<char>::~allocator((allocator<char> *)((long)expected7 + 0x27));
  GVar3 = local_14;
  expected7[2] = 0;
  expected7[3] = 0;
  expected7[4] = 0;
  expected7[5] = 0;
  uStack_8a8 = 0x8b5100000005;
  expected7[0] = 2;
  expected7[1] = 0;
  expected7[6] = 1;
  expected7[7] = 0xd;
  expected7[8] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expected8 + 10),"g",(allocator<char> *)((long)expected8 + 0x27));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,(key_type *)(expected8 + 10));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)GVar3,0x92e3,(ulong)*pmVar4,0xb,expected + 10,0xb,&uStack_8a8,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)(expected8 + 10));
  std::allocator<char>::~allocator((allocator<char> *)((long)expected8 + 0x27));
  GVar3 = local_14;
  expected8[2] = 0;
  expected8[3] = 0;
  expected8[4] = 0;
  expected8[5] = 0;
  uStack_8f8 = 0x140400000002;
  expected8[0] = 1;
  expected8[1] = 0;
  expected8[6] = 1;
  expected8[7] = 0xf;
  expected8[8] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_918,"h",&local_919);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_918);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)GVar3,0x92e3,(ulong)*pmVar4,0xb,expected + 10,0xb,&uStack_8f8,
            &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_14);
  sVar2 = indices._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_a0);
  return sVar2;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "a");
		glBindAttribLocation(program, 4, "b");
		glBindAttribLocation(program, 5, "c");
		glBindAttribLocation(program, 7, "d");
		glBindAttribLocation(program, 11, "e");
		glBindAttribLocation(program, 12, "f");
		glBindAttribLocation(program, 13, "g");
		glBindAttribLocation(program, 15, "h");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, 8, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, 5, error);

		std::map<std::string, GLuint> indices;
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "a", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "b", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "c[0]", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "d", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "e", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "f", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "g", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, indices, "h", error);

		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["a"], "a", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["b"], "b", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["c[0]"], "c[0]", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["d"], "d[0]", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["e"], "e", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["f"], "f", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["g"], "g[0]", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, indices["h"], "h", error);

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "a", 0, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "b", 4, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "c[0]", 5, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "c", 5, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "c[1]", 6, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "d[0]", 7, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "d", 7, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "e", 11, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "f", 12, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "g[0]", 13, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "g", 13, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "g[1]", 14, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "h", 15, error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_GEOMETRY_SHADER,
						   GL_REFERENCED_BY_TESS_CONTROL_SHADER,
						   GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION,
						   GL_IS_PER_PATCH };
		GLint expected[] = { 2, GL_FLOAT_MAT4, 1, 0, 0, 0, 0, 0, 1, 0, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["a"], 11, props, 11, expected, error);
		GLint expected2[] = { 2, GL_INT_VEC4, 1, 0, 0, 0, 0, 0, 1, 4, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["b"], 11, props, 11, expected2, error);
		GLint expected3[] = { 5, GL_FLOAT, 2, 0, 0, 0, 0, 0, 1, 5, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["c[0]"], 11, props, 11, expected3, error);
		GLint expected4[] = { 5, GL_FLOAT_MAT2x3, 2, 0, 0, 0, 0, 0, 1, 7, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["d"], 11, props, 11, expected4, error);
		GLint expected5[] = { 2, GL_UNSIGNED_INT_VEC2, 1, 0, 0, 0, 0, 0, 1, 11, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["e"], 11, props, 11, expected5, error);
		GLint expected6[] = { 2, GL_UNSIGNED_INT, 1, 0, 0, 0, 0, 0, 1, 12, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["f"], 11, props, 11, expected6, error);
		GLint expected7[] = { 5, GL_FLOAT_VEC3, 2, 0, 0, 0, 0, 0, 1, 13, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["g"], 11, props, 11, expected7, error);
		GLint expected8[] = { 2, GL_INT, 1, 0, 0, 0, 0, 0, 1, 15, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, indices["h"], 11, props, 11, expected8, error);

		glDeleteProgram(program);
		return error;
	}